

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O1

REF_STATUS ref_mpi_bcast(REF_MPI ref_mpi,void *data,REF_INT n,REF_TYPE type)

{
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_bcast(REF_MPI ref_mpi, void *data, REF_INT n,
                                 REF_TYPE type) {
#ifdef HAVE_MPI
  MPI_Datatype datatype;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_type_mpi_type(type, datatype);

  MPI_Bcast(data, n, datatype, 0, ref_mpi_comm(ref_mpi));
#else
  SUPRESS_UNUSED_COMPILER_WARNING(ref_mpi);
  SUPRESS_UNUSED_COMPILER_WARNING(data);
  SUPRESS_UNUSED_COMPILER_WARNING(n);
  SUPRESS_UNUSED_COMPILER_WARNING(type);
#endif

  return REF_SUCCESS;
}